

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

void jsonnet_json_object_append(JsonnetVm *vm,JsonnetJsonValue *obj,char *f,JsonnetJsonValue *v)

{
  __uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> __p;
  __uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *this;
  allocator<char> local_31;
  __uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> local_30;
  key_type local_28;
  
  if (obj->kind == OBJECT) {
    local_30._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>
    .super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl =
         (tuple<JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>)
         (tuple<JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>)v;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,f,&local_31);
    this = (__uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
           ::operator[](&obj->fields,&local_28);
    __p._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
    super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl =
         local_30._M_t.
         super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
         super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl;
    local_30._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>
    .super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl =
         (tuple<JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>)
         (_Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>)0x0;
    std::__uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::reset
              (this,(pointer)__p._M_t.
                             super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>
                             .super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl);
    std::__cxx11::string::~string((string *)&local_28);
    std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::~unique_ptr
              ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)&local_30);
    return;
  }
  __assert_fail("obj->kind == JsonnetJsonValue::OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/libjsonnet.cpp"
                ,200,
                "void jsonnet_json_object_append(JsonnetVm *, JsonnetJsonValue *, const char *, JsonnetJsonValue *)"
               );
}

Assistant:

void jsonnet_json_object_append(JsonnetVm *vm, JsonnetJsonValue *obj, const char *f,
                                JsonnetJsonValue *v)
{
    (void)vm;
    assert(obj->kind == JsonnetJsonValue::OBJECT);
    obj->fields[std::string(f)] = std::unique_ptr<JsonnetJsonValue>(v);
}